

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

int GetSpriteIndex(char *spritename,bool add)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  spritedef_t *__s1;
  undefined1 local_34 [8];
  spritedef_t temp;
  uint i_1;
  int i;
  char upper [5];
  char *pcStack_18;
  bool add_local;
  char *spritename_local;
  
  i._3_1_ = add;
  pcStack_18 = spritename;
  memset((void *)((long)&i_1 + 2),0,5);
  temp.numframes = '\0';
  temp._9_1_ = 0;
  temp.spriteframes = 0;
  for (; pcStack_18[(int)temp._8_4_] != '\0' && (int)temp._8_4_ < 4; temp._8_4_ = temp._8_4_ + 1) {
    iVar2 = toupper((int)pcStack_18[(int)temp._8_4_]);
    *(char *)((long)&i_1 + (long)(int)temp._8_4_ + 2) = (char)iVar2;
  }
  iVar2 = strcmp((char *)((long)&i_1 + 2),GetSpriteIndex::lastsprite);
  if (iVar2 == 0) {
    spritename_local._4_4_ = GetSpriteIndex::lastindex;
  }
  else {
    strcpy(GetSpriteIndex::lastsprite,(char *)((long)&i_1 + 2));
    for (temp.field_0._4_4_ = 0; uVar1 = temp.field_0._4_4_,
        uVar3 = TArray<spritedef_t,_spritedef_t>::Size(&sprites), (uint)uVar1 < uVar3;
        temp.field_0._4_4_ = temp.field_0._4_4_ + 1) {
      __s1 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(ulong)(uint)temp.field_0._4_4_);
      iVar2 = strcmp((char *)__s1,(char *)((long)&i_1 + 2));
      if (iVar2 == 0) {
        GetSpriteIndex::lastindex = temp.field_0._4_4_;
        return temp.field_0._4_4_;
      }
    }
    if ((i._3_1_ & 1) == 0) {
      spritename_local._4_4_ = 0xffffffff;
    }
    else {
      strcpy(local_34,(char *)((long)&i_1 + 2));
      temp.field_0.name[0] = '\0';
      temp.field_0.dwName._2_2_ = 0;
      spritename_local._4_4_ =
           TArray<spritedef_t,_spritedef_t>::Push(&sprites,(spritedef_t *)local_34);
    }
  }
  GetSpriteIndex::lastindex = spritename_local._4_4_;
  return spritename_local._4_4_;
}

Assistant:

int GetSpriteIndex(const char * spritename, bool add)
{
	static char lastsprite[5];
	static int lastindex;

	// Make sure that the string is upper case and 4 characters long
	char upper[5]={0,0,0,0,0};
	for (int i = 0; spritename[i] != 0 && i < 4; i++)
	{
		upper[i] = toupper (spritename[i]);
	}

	// cache the name so if the next one is the same the function doesn't have to perform a search.
	if (!strcmp(upper, lastsprite))
	{
		return lastindex;
	}
	strcpy(lastsprite, upper);

	for (unsigned i = 0; i < sprites.Size (); ++i)
	{
		if (strcmp (sprites[i].name, upper) == 0)
		{
			return (lastindex = (int)i);
		}
	}
	if (!add)
	{
		return (lastindex = -1);
	}
	spritedef_t temp;
	strcpy (temp.name, upper);
	temp.numframes = 0;
	temp.spriteframes = 0;
	return (lastindex = (int)sprites.Push (temp));
}